

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btSingleSweepCallback::btSingleSweepCallback
          (btSingleSweepCallback *this,btConvexShape *castShape,btTransform *convexFromTrans,
          btTransform *convexToTrans,btCollisionWorld *world,ConvexResultCallback *resultCallback,
          btScalar allowedPenetration)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  btVector3 bVar9;
  btVector3 unnormalizedRayDir;
  btVector3 local_20;
  
  (this->super_btBroadphaseRayCallback).super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback = (_func_int **)&PTR__btBroadphaseAabbCallback_001ecd48;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_origin.m_floats =
       *(undefined8 *)(convexFromTrans->m_origin).m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_origin.m_floats =
       *(undefined8 *)(convexToTrans->m_origin).m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_origin.m_floats + 2) = uVar1;
  this->m_world = world;
  this->m_resultCallback = resultCallback;
  this->m_allowedCcdPenetration = allowedPenetration;
  this->m_castShape = castShape;
  local_20 = operator-(&(this->m_convexToTrans).m_origin,&(this->m_convexFromTrans).m_origin);
  bVar9 = btVector3::normalized(&local_20);
  fVar4 = bVar9.m_floats[2];
  uVar2 = -(uint)(bVar9.m_floats[0] == 0.0);
  uVar3 = -(uint)(bVar9.m_floats[1] == 0.0);
  auVar7._8_4_ = extraout_XMM0_Dc;
  auVar7._0_8_ = bVar9.m_floats._0_8_;
  auVar7._12_4_ = extraout_XMM0_Dd;
  auVar7 = divps(_DAT_001af400,auVar7);
  fVar5 = (float)(uVar2 & 0x5d5e0b6b | ~uVar2 & auVar7._0_4_);
  fVar6 = (float)(uVar3 & 0x5d5e0b6b | ~uVar3 & auVar7._4_4_);
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[0] = fVar5;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[1] = fVar6;
  fVar8 = (float)(-(uint)(fVar4 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar4 == 0.0) & (uint)(1.0 / fVar4))
  ;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[2] = fVar8;
  *(ulong *)(this->super_btBroadphaseRayCallback).m_signs =
       CONCAT44(-(uint)(fVar6 < 0.0),-(uint)(fVar5 < 0.0)) & 0x100000001;
  (this->super_btBroadphaseRayCallback).m_signs[2] = (uint)(fVar8 < 0.0);
  (this->super_btBroadphaseRayCallback).m_lambda_max =
       local_20.m_floats[2] * fVar4 +
       bVar9.m_floats[0] * local_20.m_floats[0] + bVar9.m_floats[1] * local_20.m_floats[1];
  return;
}

Assistant:

btSingleSweepCallback(const btConvexShape* castShape, const btTransform& convexFromTrans,const btTransform& convexToTrans,const btCollisionWorld* world,btCollisionWorld::ConvexResultCallback& resultCallback,btScalar allowedPenetration)
		:m_convexFromTrans(convexFromTrans),
		m_convexToTrans(convexToTrans),
		m_world(world),
		m_resultCallback(resultCallback),
		m_allowedCcdPenetration(allowedPenetration),
		m_castShape(castShape)
	{
		btVector3 unnormalizedRayDir = (m_convexToTrans.getOrigin()-m_convexFromTrans.getOrigin());
		btVector3 rayDir = unnormalizedRayDir.normalized();
		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(unnormalizedRayDir);

	}